

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpexternaltransmitter.cpp
# Opt level: O0

void __thiscall
jrtplib::RTPExternalTransmitter::RTPExternalTransmitter
          (RTPExternalTransmitter *this,RTPMemoryManager *mgr)

{
  RTPMemoryManager *mgr_local;
  RTPExternalTransmitter *this_local;
  
  RTPTransmitter::RTPTransmitter(&this->super_RTPTransmitter,mgr);
  (this->super_RTPTransmitter).super_RTPMemoryObject._vptr_RTPMemoryObject =
       (_func_int **)&PTR__RTPExternalTransmitter_00193470;
  RTPExternalPacketInjecter::RTPExternalPacketInjecter(&this->packetinjector,this);
  std::__cxx11::list<jrtplib::RTPRawPacket_*,_std::allocator<jrtplib::RTPRawPacket_*>_>::list
            (&this->rawpacketlist);
  RTPAbortDescriptors::RTPAbortDescriptors(&this->m_abortDesc);
  this->created = false;
  this->init = false;
  return;
}

Assistant:

RTPExternalTransmitter::RTPExternalTransmitter(RTPMemoryManager *mgr) : RTPTransmitter(mgr), packetinjector((RTPExternalTransmitter *)this)
{
	created = false;
	init = false;
}